

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

BlockStatement *
slang::ast::createBlockStatement
          (Compilation *comp,SmallVectorBase<const_slang::ast::Statement_*> *buffer,
          SyntaxNode *syntax,StatementBlockKind blocKind)

{
  int iVar1;
  undefined4 extraout_var;
  StatementList *args;
  BlockStatement *pBVar2;
  StatementBlockKind local_3c;
  SourceRange local_38;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> local_28;
  
  local_3c = blocKind;
  if (buffer->len == 1) {
    args = (StatementList *)*buffer->data_;
  }
  else {
    iVar1 = SmallVectorBase<const_slang::ast::Statement_*>::copy
                      (buffer,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)syntax);
    local_28._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
    local_38 = slang::syntax::SyntaxNode::sourceRange(syntax);
    args = BumpAllocator::
           emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*,18446744073709551615ul>,slang::SourceRange>
                     (&comp->super_BumpAllocator,&local_28,&local_38);
  }
  pBVar2 = BumpAllocator::
           emplace<slang::ast::BlockStatement,slang::ast::Statement_const&,slang::ast::StatementBlockKind&,slang::SourceRange_const&>
                     (&comp->super_BumpAllocator,&args->super_Statement,&local_3c,
                      &(args->super_Statement).sourceRange);
  return pBVar2;
}

Assistant:

static BlockStatement* createBlockStatement(
    Compilation& comp, SmallVectorBase<const Statement*>& buffer, const SyntaxNode& syntax,
    StatementBlockKind blocKind = StatementBlockKind::Sequential) {

    const Statement* body;
    if (buffer.size() == 1)
        body = buffer[0];
    else
        body = comp.emplace<StatementList>(buffer.copy(comp), syntax.sourceRange());

    return comp.emplace<BlockStatement>(*body, blocKind, body->sourceRange);
}